

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

void notch::core::SGD::train
               (unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                *rng,Net *net,LabeledDataset *trainSet,int epochs,EpochCallback *epochCallback,
               IterationCallback *sampleCallback)

{
  element_type *peVar1;
  bool bVar2;
  LabeledDataset *pLVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  Array *pAVar7;
  undefined4 extraout_var;
  pointer pvVar8;
  Array *inputs;
  byte bVar9;
  int currentIteration;
  bool bVar10;
  LabeledDataset *__range3;
  int local_68;
  int local_64;
  EpochCallback *local_60;
  unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
  *local_58;
  LabeledDataset *local_50;
  IterationCallback *local_48;
  pointer local_40;
  Array *local_38;
  
  bVar2 = 0 < epochs;
  local_58 = rng;
  local_50 = trainSet;
  local_48 = sampleCallback;
  if (0 < epochs) {
    local_60 = epochCallback;
    bVar4 = EpochCallback::operator()(epochCallback,0,false);
    if (!bVar4) {
      local_68 = 0;
      do {
        pLVar3 = local_50;
        LabeledDataset::shuffle(local_50,local_58);
        inputs = (pLVar3->inputs).
                 super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_38 = (pLVar3->inputs).
                   super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        pvVar8 = (pLVar3->outputs).
                 super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_40 = (pLVar3->outputs).
                   super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        bVar10 = inputs == local_38;
        bVar4 = pvVar8 == local_40 && bVar10;
        if (pvVar8 != local_40 || !bVar10) {
          currentIteration = 0;
          do {
            pAVar7 = Net::output(net,inputs);
            peVar1 = (net->lossLayer).
                     super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            (*peVar1->_vptr_ALossLayer[1])(peVar1,pAVar7,pvVar8);
            Net::selfCheck(net);
            iVar6 = (*((net->lossLayer).
                       super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->_vptr_ALossLayer[2])();
            Net::backprop(net,(Array *)CONCAT44(extraout_var,iVar6));
            Net::update(net);
            bVar5 = IterationCallback::operator()(local_48,currentIteration,false);
            if (bVar5) {
              if (!bVar4) goto LAB_0011c5a1;
              break;
            }
            currentIteration = currentIteration + 1;
            bVar9 = ~bVar10 & pvVar8 != local_40;
            inputs = inputs + bVar9;
            pvVar8 = pvVar8 + bVar9;
            bVar10 = inputs == local_38;
            bVar4 = pvVar8 == local_40 && bVar10;
          } while (pvVar8 != local_40 || !bVar10);
        }
        local_68 = local_68 + 1;
        epochCallback = local_60;
        if (local_68 == epochs) goto LAB_0011c5ad;
        bVar2 = local_68 < epochs;
        bVar4 = EpochCallback::operator()(local_60,local_68,false);
      } while (!bVar4);
    }
LAB_0011c5a1:
    epochCallback = local_60;
    if (bVar2) {
      return;
    }
  }
LAB_0011c5ad:
  local_64 = epochs;
  if ((epochCallback->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(epochCallback->callback)._M_invoker)((_Any_data *)&epochCallback->callback,&local_64);
    return;
  }
  ::std::__throw_bad_function_call();
}

Assistant:

static
    void train(std::unique_ptr<RNG> &rng,
            Net &net, LabeledDataset &trainSet, int epochs,
            const EpochCallback &epochCallback = noEpochCallback,
            const IterationCallback &sampleCallback = noIterationCallback) {
        for (int j = 0; j < epochs; ++j) {
            if (epochCallback(j)) {
                return;
            }
            trainSet.shuffle(rng);
            int sampleCounter = 0;
            for (auto sample : trainSet) {
                net.loss(sample.data, sample.label);
                net.backprop();
                net.update();
                if (sampleCallback(sampleCounter)) {
                    return;
                }
                ++sampleCounter;
            }
        }
        epochCallback(epochs, true);
    }